

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O2

void protodec_initialize(demod_state_t *d,serial_state_t *serial,char chanid)

{
  uchar *puVar1;
  char *pcVar2;
  
  d->chanid = '\0';
  *(undefined3 *)&d->field_0x1 = 0;
  d->state = 0;
  d->offset = 0;
  d->nskurr = 0;
  d->serial = (serial_state_t *)0x0;
  d->nmea = (char *)0x0;
  d->receivedframes = 0;
  d->lostframes = 0;
  d->lostframes2 = 0;
  d->seqnr = '\0';
  *(undefined3 *)&d->field_0x5d = 0;
  d->bufferpos = 0;
  d->last = '\0';
  *(undefined3 *)&d->field_0x45 = 0;
  d->antallpreamble = 0;
  d->bitstuff = 0;
  d->npreamble = 0;
  d->nstartsign = 0;
  d->ndata = 0;
  d->nstopsign = 0;
  *(undefined8 *)&d->antallenner = 0;
  d->buffer = (uchar *)0x0;
  d->rbuffer = (uchar *)0x0;
  d->tbuffer = (char *)0x0;
  d->chanid = chanid;
  d->serial = serial;
  d->lostframes = 0;
  d->state = 1;
  d->last = '\0';
  d->bufferpos = 0;
  d->nskurr = 0;
  d->npreamble = 0;
  d->nstartsign = 0;
  d->ndata = 0;
  d->nstopsign = 0;
  d->antallenner = 0;
  puVar1 = (uchar *)hmalloc(0x1c2);
  d->buffer = puVar1;
  puVar1 = (uchar *)hmalloc(0x1c2);
  d->rbuffer = puVar1;
  pcVar2 = (char *)hmalloc(100);
  d->nmea = pcVar2;
  return;
}

Assistant:

void protodec_initialize(struct demod_state_t *d, struct serial_state_t *serial, char chanid)
{
	memset(d, 0, sizeof(struct demod_state_t));

	d->chanid = chanid;
	d->serial = serial;
	
	d->receivedframes = 0;
	d->lostframes = 0;
	d->lostframes2 = 0;
	
	protodec_reset(d);
	
	d->seqnr = 0;
	
    d->buffer = hmalloc(DEMOD_BUFFER_LEN);
    d->rbuffer = hmalloc(DEMOD_BUFFER_LEN);
    d->nmea = hmalloc(NMEABUFFER_LEN);
}